

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::sse42::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  int iVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long *plVar8;
  long lVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  _func_int *p_Var17;
  undefined1 auVar18 [12];
  undefined1 in_XMM0 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar28;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar27 [16];
  undefined1 auVar29 [12];
  float fVar33;
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM3 [16];
  vfloat4 l02;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar44;
  undefined1 in_XMM4 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar42;
  undefined1 auVar43 [16];
  undefined1 auVar45 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar54 [12];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar60;
  undefined1 in_XMM7 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar62;
  undefined1 auVar58 [16];
  float fVar61;
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar67;
  float fVar68;
  undefined1 in_XMM8 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  undefined1 in_XMM9 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 in_XMM10 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 in_XMM14 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  RayQueryContext newcontext;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118;
  float local_108;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar26 [16];
  
  auVar54 = in_XMM7._0_12_;
  auVar45 = in_XMM5._0_12_;
  uVar14 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var17 = *(_func_int **)&pGVar6->field_0x58;
  if ((((p_Var17 == (_func_int *)0x0) &&
       ((uVar12 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                                  (long)pGVar6[1].intersectionFilterN * (ulong)uVar14),
        uVar12 == 0xffffffff ||
        (p_Var17 = pGVar6[1].super_RefCount._vptr_RefCount[uVar12], p_Var17 == (_func_int *)0x0))))
      || ((ray->mask & pGVar6->mask) == 0)) ||
     (pRVar7 = context->user, pRVar7->instID[0] != 0xffffffff)) {
    bVar11 = false;
  }
  else {
    pRVar7->instID[0] = prim->instID_;
    pRVar7->instPrimID[0] = uVar14;
    uVar12 = (ulong)prim->primID_;
    if (pGVar6->numTimeSteps == 1) {
      plVar8 = *(long **)&pGVar6[1].fnumTimeSegments;
      iVar5 = (int)plVar8[4];
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        if (iVar5 == 0x9134) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x10 + lVar13),0x1c);
          in_XMM10 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x20 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x14 + lVar13),0x1c);
          in_XMM4 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x24 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x18 + lVar13),0x1c);
          in_XMM3 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x28 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                             *(undefined4 *)(lVar9 + 0x1c + lVar13),0x1c);
          in_XMM2 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x2c + lVar13),0x28);
        }
        else if (iVar5 == 0x9234) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          uVar2 = *(undefined8 *)(lVar9 + 4 + lVar13);
          in_XMM10._4_4_ = (int)uVar2;
          in_XMM10._0_4_ = *(undefined4 *)(lVar9 + lVar13);
          in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM10._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar13);
          in_XMM4._4_4_ = (int)uVar2;
          in_XMM4._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar13);
          in_XMM4._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
          in_XMM3._4_4_ = (int)uVar2;
          in_XMM3._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
          in_XMM3._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar13);
          in_XMM2._4_4_ = (int)uVar2;
          in_XMM2._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar13);
          in_XMM2._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM2._12_4_ = 0;
        }
        else if (iVar5 == 0xb001) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar13);
          auVar22 = insertps(auVar39,*(undefined4 *)(lVar9 + 8 + lVar13),0x20);
          uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar13);
          auVar72._4_4_ = (int)uVar2;
          auVar72._0_4_ = *(undefined4 *)(lVar9 + lVar13);
          auVar72._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar72._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
          auVar32._4_4_ = (int)uVar2;
          auVar32._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
          auVar32._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar32._12_4_ = 0;
          fVar44 = *(float *)(lVar9 + 0x24 + lVar13);
          fVar24 = *(float *)(lVar9 + 0x28 + lVar13);
          fVar25 = *(float *)(lVar9 + 0x2c + lVar13);
          fVar28 = *(float *)(lVar9 + 0x30 + lVar13);
          fVar63 = fVar28 * fVar28 + fVar25 * fVar25 + fVar44 * fVar44 + fVar24 * fVar24;
          auVar88 = rsqrtss(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
          fVar50 = auVar88._0_4_;
          auVar58._4_12_ = auVar88._4_12_;
          fVar50 = fVar50 * fVar50 * fVar63 * -0.5 * fVar50 + fVar50 * 1.5;
          in_XMM2 = insertps(auVar32,ZEXT416((uint)(fVar44 * fVar50)),0x30);
          in_XMM10 = insertps(auVar72,ZEXT416((uint)(fVar24 * fVar50)),0x30);
          auVar58._0_4_ = fVar50 * fVar28;
          auVar88 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                             *(undefined4 *)(lVar9 + 4 + lVar13),0x10);
          in_XMM3 = insertps(auVar22,auVar58,0x30);
          auVar22 = insertps(auVar88,*(undefined4 *)(lVar9 + 0x3c + lVar13),0x20);
          in_XMM4 = insertps(auVar22,ZEXT416((uint)(fVar25 * fVar50)),0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          in_XMM10 = *(undefined1 (*) [16])(lVar9 + lVar13);
          in_XMM4 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar13);
          in_XMM3 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar13);
          in_XMM2 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar13);
        }
        fVar63 = in_XMM2._8_4_;
        fVar44 = in_XMM2._12_4_;
        fVar34 = in_XMM10._12_4_;
        fVar33 = in_XMM4._4_4_;
        fVar28 = in_XMM4._12_4_;
        fVar78 = in_XMM3._8_4_;
        fVar25 = in_XMM3._12_4_;
        fVar71 = fVar34 * fVar28 + fVar25 * fVar44;
        fVar50 = fVar34 * fVar28 - fVar25 * fVar44;
        fVar52 = fVar44 * fVar44 + fVar34 * fVar34 + -fVar28 * fVar28 + -fVar25 * fVar25;
        fVar79 = fVar44 * fVar44 - fVar34 * fVar34;
        fVar69 = fVar28 * fVar28 + fVar79 + -fVar25 * fVar25;
        fVar60 = fVar34 * fVar25 - fVar28 * fVar44;
        fVar24 = fVar28 * fVar44 + fVar34 * fVar25;
        fVar62 = fVar28 * fVar25 + fVar34 * fVar44;
        fVar44 = fVar28 * fVar25 - fVar34 * fVar44;
        fVar71 = fVar71 + fVar71;
        fVar60 = fVar60 + fVar60;
        fVar64 = in_XMM10._0_4_;
        fVar34 = fVar25 * fVar25 + fVar79 + -fVar28 * fVar28;
        fVar53 = fVar52 * 1.0 + fVar71 * 0.0 + fVar60 * 0.0;
        fVar61 = fVar52 * 0.0 + fVar71 * 1.0 + fVar60 * 0.0;
        fVar51 = fVar52 * 0.0 + fVar71 * 0.0 + fVar60 * 1.0;
        fVar60 = fVar52 * 0.0 + fVar71 * 0.0 + fVar60 * 0.0;
        fVar62 = fVar62 + fVar62;
        fVar50 = fVar50 + fVar50;
        fVar52 = fVar50 * 1.0 + fVar69 * 0.0 + fVar62 * 0.0;
        fVar71 = fVar50 * 0.0 + fVar69 * 1.0 + fVar62 * 0.0;
        fVar79 = fVar50 * 0.0 + fVar69 * 0.0 + fVar62 * 1.0;
        fVar69 = fVar50 * 0.0 + fVar69 * 0.0 + fVar62 * 0.0;
        auVar65._0_8_ = in_XMM10._4_8_;
        auVar65._8_8_ = 0;
        auVar22 = blendps(auVar65,in_XMM4,4);
        fVar24 = fVar24 + fVar24;
        fVar44 = fVar44 + fVar44;
        fVar25 = fVar24 * 1.0 + fVar44 * 0.0 + fVar34 * 0.0;
        fVar28 = fVar24 * 0.0 + fVar44 * 1.0 + fVar34 * 0.0;
        fVar50 = fVar24 * 0.0 + fVar44 * 0.0 + fVar34 * 1.0;
        fVar24 = fVar24 * 0.0 + fVar44 * 0.0 + fVar34 * 0.0;
        fVar34 = fVar24 * 0.0;
        in_XMM14._0_4_ = fVar64 * fVar53 + fVar52 * 0.0 + fVar25 * 0.0;
        in_XMM14._4_4_ = fVar64 * fVar61 + fVar71 * 0.0 + fVar28 * 0.0;
        in_XMM14._8_4_ = fVar64 * fVar51 + fVar79 * 0.0 + fVar50 * 0.0;
        in_XMM14._12_4_ = fVar64 * fVar60 + fVar69 * 0.0 + fVar34;
        fVar44 = in_XMM4._0_4_;
        in_XMM1._0_4_ = fVar44 * fVar53 + fVar33 * fVar52 + fVar25 * 0.0;
        in_XMM1._4_4_ = fVar44 * fVar61 + fVar33 * fVar71 + fVar28 * 0.0;
        in_XMM1._8_4_ = fVar44 * fVar51 + fVar33 * fVar79 + fVar50 * 0.0;
        in_XMM1._12_4_ = fVar44 * fVar60 + fVar33 * fVar69 + fVar34;
        fVar33 = in_XMM3._4_4_;
        fVar44 = in_XMM3._0_4_;
        in_XMM0._0_4_ = fVar44 * fVar53 + fVar33 * fVar52 + fVar78 * fVar25;
        in_XMM0._4_4_ = fVar44 * fVar61 + fVar33 * fVar71 + fVar78 * fVar28;
        in_XMM0._8_4_ = fVar44 * fVar51 + fVar33 * fVar79 + fVar78 * fVar50;
        in_XMM0._12_4_ = fVar44 * fVar60 + fVar33 * fVar69 + fVar78 * fVar24;
        fVar24 = in_XMM2._4_4_;
        fVar44 = in_XMM2._0_4_;
        auVar45._0_4_ = fVar44 * fVar53 + fVar24 * fVar52 + fVar63 * fVar25 + auVar22._0_4_ + 0.0;
        auVar45._4_4_ = fVar44 * fVar61 + fVar24 * fVar71 + fVar63 * fVar28 + auVar22._4_4_ + 0.0;
        auVar45._8_4_ = fVar44 * fVar51 + fVar24 * fVar79 + fVar63 * fVar50 + auVar22._8_4_ + 0.0;
      }
      else if (iVar5 == 0x9134) {
        lVar9 = *plVar8;
        lVar13 = uVar12 * plVar8[2];
        auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + lVar13)),*(undefined4 *)(lVar9 + 0x10 + lVar13)
                           ,0x1c);
        in_XMM14 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x20 + lVar13),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar13)),
                           *(undefined4 *)(lVar9 + 0x14 + lVar13),0x1c);
        in_XMM1 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x24 + lVar13),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar13)),
                           *(undefined4 *)(lVar9 + 0x18 + lVar13),0x1c);
        in_XMM0 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x28 + lVar13),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                           *(undefined4 *)(lVar9 + 0x1c + lVar13),0x1c);
        auVar22 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x2c + lVar13),0x28);
        auVar45 = auVar22._0_12_;
      }
      else if (iVar5 == 0x9234) {
        lVar9 = *plVar8;
        lVar13 = uVar12 * plVar8[2];
        uVar2 = *(undefined8 *)(lVar9 + 4 + lVar13);
        in_XMM14._4_4_ = (float)(int)uVar2;
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar9 + lVar13);
        in_XMM14._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM14._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar13);
        in_XMM1._4_4_ = (float)(int)uVar2;
        in_XMM1._0_4_ = (float)*(undefined4 *)(lVar9 + 0xc + lVar13);
        in_XMM1._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM1._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
        in_XMM0._4_4_ = (float)(int)uVar2;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar9 + 0x18 + lVar13);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar13);
        auVar45._4_4_ = (float)(int)uVar2;
        auVar45._0_4_ = (float)*(undefined4 *)(lVar9 + 0x24 + lVar13);
        auVar45._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
      }
      else if (iVar5 == 0xb001) {
        lVar9 = *plVar8;
        lVar13 = uVar12 * plVar8[2];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar13);
        auVar22 = insertps(auVar19,*(undefined4 *)(lVar9 + 8 + lVar13),0x20);
        uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar13);
        auVar86._4_4_ = (int)uVar2;
        auVar86._0_4_ = *(undefined4 *)(lVar9 + lVar13);
        auVar86._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar86._12_4_ = 0;
        uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
        auVar46._4_4_ = (int)uVar2;
        auVar46._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
        auVar46._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar46._12_4_ = 0;
        fVar44 = *(float *)(lVar9 + 0x24 + lVar13);
        fVar24 = *(float *)(lVar9 + 0x28 + lVar13);
        fVar25 = *(float *)(lVar9 + 0x2c + lVar13);
        fVar28 = *(float *)(lVar9 + 0x30 + lVar13);
        fVar63 = fVar28 * fVar28 + fVar25 * fVar25 + fVar44 * fVar44 + fVar24 * fVar24;
        auVar88 = rsqrtss(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
        fVar50 = auVar88._0_4_;
        auVar55._4_12_ = auVar88._4_12_;
        fVar50 = fVar50 * fVar50 * fVar63 * -0.5 * fVar50 + fVar50 * 1.5;
        auVar88 = insertps(auVar46,ZEXT416((uint)(fVar44 * fVar50)),0x30);
        auVar45 = auVar88._0_12_;
        in_XMM14 = insertps(auVar86,ZEXT416((uint)(fVar24 * fVar50)),0x30);
        auVar55._0_4_ = fVar50 * fVar28;
        auVar88 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                           *(undefined4 *)(lVar9 + 4 + lVar13),0x10);
        in_XMM0 = insertps(auVar22,auVar55,0x30);
        auVar22 = insertps(auVar88,*(undefined4 *)(lVar9 + 0x3c + lVar13),0x20);
        in_XMM1 = insertps(auVar22,ZEXT416((uint)(fVar25 * fVar50)),0x30);
      }
      else if (iVar5 == 0x9244) {
        lVar9 = *plVar8;
        lVar13 = uVar12 * plVar8[2];
        in_XMM14 = *(undefined1 (*) [16])(lVar9 + lVar13);
        in_XMM1 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar13);
        in_XMM0 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar13);
        auVar45 = SUB1612(*(undefined1 (*) [16])(lVar9 + 0x30 + lVar13),0);
      }
    }
    else {
      fVar44 = (pGVar6->time_range).lower;
      auVar29._0_4_ = (pGVar6->time_range).upper - fVar44;
      auVar29._4_8_ = 0;
      fVar24 = (((ray->dir).field_0.m128[3] - fVar44) / auVar29._0_4_) * pGVar6->fnumTimeSegments;
      auVar22 = roundss(ZEXT416((uint)fVar44),ZEXT416((uint)fVar24),9);
      fVar44 = pGVar6->fnumTimeSegments + -1.0;
      if (fVar44 <= auVar22._0_4_) {
        auVar22._0_4_ = fVar44;
      }
      auVar18 = ZEXT812(0);
      if (0.0 <= auVar22._0_4_) {
        auVar18._4_8_ = 0;
        auVar18._0_4_ = auVar22._0_4_;
      }
      auVar88._12_4_ = 0;
      auVar88._0_12_ = auVar18;
      uVar14 = (uint)auVar18._0_4_;
      fVar24 = fVar24 - auVar18._0_4_;
      lVar9 = *(long *)&pGVar6[1].fnumTimeSegments;
      plVar8 = (long *)(lVar9 + (ulong)uVar14 * 0x38);
      iVar5 = *(int *)(lVar9 + 0x20 + (ulong)uVar14 * 0x38);
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        if (iVar5 == 0x9134) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x10 + lVar16),0x1c);
          _local_158 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x20 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 4 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x14 + lVar16),0x1c);
          _local_128 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x24 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 8 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x18 + lVar16),0x1c);
          _local_168 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x28 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 0x1c + lVar16),0x1c);
          _local_138 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x2c + lVar16),0x28);
        }
        else if (iVar5 == 0x9234) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          uVar2 = *(undefined8 *)(lVar13 + 4 + lVar16);
          local_158._4_4_ = (int)uVar2;
          local_158._0_4_ = *(undefined4 *)(lVar13 + lVar16);
          fStack_150 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_14c = 0.0;
          uVar2 = *(undefined8 *)(lVar13 + 0x10 + lVar16);
          local_128._4_4_ = (int)uVar2;
          local_128._0_4_ = *(undefined4 *)(lVar13 + 0xc + lVar16);
          fStack_120 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_11c = 0.0;
          uVar2 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          local_168._4_4_ = (int)uVar2;
          local_168._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          fStack_160 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_15c = 0.0;
          uVar2 = *(undefined8 *)(lVar13 + 0x28 + lVar16);
          local_138._4_4_ = (int)uVar2;
          local_138._0_4_ = *(undefined4 *)(lVar13 + 0x24 + lVar16);
          fStack_130 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_12c = 0.0;
        }
        else if (iVar5 == 0xb001) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar16);
          auVar88 = insertps(auVar70,*(undefined4 *)(lVar13 + 8 + lVar16),0x20);
          uVar2 = *(undefined8 *)(lVar13 + 0x34 + lVar16);
          auVar76._4_4_ = (int)uVar2;
          auVar76._0_4_ = *(undefined4 *)(lVar13 + lVar16);
          auVar76._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar76._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          auVar73._4_4_ = (int)uVar2;
          auVar73._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          auVar73._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar73._12_4_ = 0;
          fVar44 = *(float *)(lVar13 + 0x24 + lVar16);
          fVar25 = *(float *)(lVar13 + 0x28 + lVar16);
          fVar28 = *(float *)(lVar13 + 0x2c + lVar16);
          fVar50 = *(float *)(lVar13 + 0x30 + lVar16);
          fVar78 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar25 * fVar25;
          auVar22 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
          fVar63 = auVar22._0_4_;
          auVar38._4_12_ = auVar22._4_12_;
          fVar63 = fVar63 * fVar63 * fVar78 * -0.5 * fVar63 + fVar63 * 1.5;
          in_XMM10 = insertps(auVar73,ZEXT416((uint)(fVar44 * fVar63)),0x30);
          in_XMM7 = insertps(auVar76,ZEXT416((uint)(fVar25 * fVar63)),0x30);
          auVar38._0_4_ = fVar63 * fVar50;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 4 + lVar16),0x10);
          in_XMM9 = insertps(auVar88,auVar38,0x30);
          auVar22 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x3c + lVar16),0x20);
          in_XMM8 = insertps(auVar22,ZEXT416((uint)(fVar28 * fVar63)),0x30);
          _local_168 = in_XMM9;
          _local_158 = in_XMM7;
          _local_138 = in_XMM10;
          _local_128 = in_XMM8;
        }
        else if (iVar5 == 0x9244) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          _local_158 = *(undefined1 (*) [16])(lVar13 + lVar16);
          _local_128 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar16);
          _local_168 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar16);
          _local_138 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar16);
        }
        lVar13 = (ulong)(uVar14 + 1) * 0x38;
        plVar8 = (long *)(lVar9 + lVar13);
        iVar5 = *(int *)(lVar9 + 0x20 + lVar13);
        if (iVar5 == 0x9134) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x10 + lVar13),0x1c);
          in_XMM7 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x20 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x14 + lVar13),0x1c);
          in_XMM9 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x24 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x18 + lVar13),0x1c);
          in_XMM8 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x28 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                             *(undefined4 *)(lVar9 + 0x1c + lVar13),0x1c);
          in_XMM10 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x2c + lVar13),0x28);
        }
        else if (iVar5 == 0x9234) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          uVar2 = *(undefined8 *)(lVar9 + 4 + lVar13);
          in_XMM7._4_4_ = (int)uVar2;
          in_XMM7._0_4_ = *(undefined4 *)(lVar9 + lVar13);
          in_XMM7._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM7._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar13);
          in_XMM9._4_4_ = (int)uVar2;
          in_XMM9._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar13);
          in_XMM9._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM9._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
          in_XMM8._4_4_ = (int)uVar2;
          in_XMM8._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
          in_XMM8._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM8._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar13);
          in_XMM10._4_4_ = (int)uVar2;
          in_XMM10._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar13);
          in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM10._12_4_ = 0;
        }
        else if (iVar5 == 0xb001) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar13);
          auVar88 = insertps(auVar66,*(undefined4 *)(lVar9 + 8 + lVar13),0x20);
          uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar13);
          auVar59._4_4_ = (int)uVar2;
          auVar59._0_4_ = *(undefined4 *)(lVar9 + lVar13);
          auVar59._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar59._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
          auVar74._4_4_ = (int)uVar2;
          auVar74._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
          auVar74._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar74._12_4_ = 0;
          fVar44 = *(float *)(lVar9 + 0x24 + lVar13);
          fVar25 = *(float *)(lVar9 + 0x28 + lVar13);
          fVar28 = *(float *)(lVar9 + 0x2c + lVar13);
          fVar50 = *(float *)(lVar9 + 0x30 + lVar13);
          fVar78 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar25 * fVar25;
          auVar22 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
          fVar63 = auVar22._0_4_;
          auVar43._4_12_ = auVar22._4_12_;
          fVar63 = fVar63 * fVar63 * fVar78 * -0.5 * fVar63 + fVar63 * 1.5;
          in_XMM10 = insertps(auVar74,ZEXT416((uint)(fVar44 * fVar63)),0x30);
          in_XMM7 = insertps(auVar59,ZEXT416((uint)(fVar25 * fVar63)),0x30);
          auVar43._0_4_ = fVar63 * fVar50;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                             *(undefined4 *)(lVar9 + 4 + lVar13),0x10);
          in_XMM8 = insertps(auVar88,auVar43,0x30);
          auVar22 = insertps(auVar22,*(undefined4 *)(lVar9 + 0x3c + lVar13),0x20);
          in_XMM9 = insertps(auVar22,ZEXT416((uint)(fVar28 * fVar63)),0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          in_XMM7 = *(undefined1 (*) [16])(lVar9 + lVar13);
          in_XMM9 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar13);
          in_XMM8 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar13);
          in_XMM10 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar13);
        }
        local_118 = in_XMM10._12_4_;
        local_108 = in_XMM7._12_4_;
        fVar50 = in_XMM9._12_4_;
        fVar28 = in_XMM8._12_4_;
        fVar25 = fStack_15c * fVar28 +
                 fStack_11c * fVar50 + fStack_12c * local_118 + fStack_14c * local_108;
        fVar44 = -fVar25;
        if (fVar25 < fVar44) {
          local_118 = -local_118;
          local_108 = -local_108;
        }
        fVar78 = fVar44;
        fVar63 = -fVar28;
        if (fVar44 <= fVar25) {
          fVar78 = fVar25;
          fVar63 = fVar28;
        }
        fVar33 = ABS(fVar25);
        fVar28 = 1.0 - fVar33;
        if (fVar28 < 0.0) {
          fVar28 = sqrtf(fVar28);
        }
        else {
          fVar28 = SQRT(fVar28);
        }
        fVar34 = 1.5707964 -
                 fVar28 * (((((fVar33 * -0.0043095737 + 0.0192803) * fVar33 + -0.04489909) * fVar33
                            + 0.08785567) * fVar33 + -0.21450998) * fVar33 + 1.5707952);
        fVar28 = 0.0;
        if (0.0 <= fVar34) {
          fVar28 = fVar34;
        }
        fVar28 = (float)(-(uint)(1.0 < fVar33) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar33) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar28 & -(uint)(fVar78 < 0.0) |
                                     ~-(uint)(fVar78 < 0.0) & (uint)fVar28))) * fVar24;
        auVar22 = ZEXT416((uint)(fVar28 * 0.63661975));
        auVar22 = roundss(auVar22,auVar22,9);
        uVar15 = (uint)auVar22._0_4_;
        fVar28 = fVar28 - auVar22._0_4_ * 1.5707964;
        fVar33 = fVar28 * fVar28;
        local_178._0_4_ =
             (float)(~-(uint)(fVar25 < fVar44) & (uint)fVar50 |
                    (uint)-fVar50 & -(uint)(fVar25 < fVar44));
        uVar14 = uVar15 & 3;
        fVar25 = ((((fVar33 * -2.5963018e-07 + 2.4756235e-05) * fVar33 + -0.001388833) * fVar33 +
                  0.04166664) * fVar33 + -0.5) * fVar33 + 1.0;
        fVar28 = (((((fVar33 * -2.5029328e-08 + 2.7600126e-06) * fVar33 + -0.00019842605) * fVar33 +
                   0.008333348) * fVar33 + -0.16666667) * fVar33 + 1.0) * fVar28;
        fVar44 = fVar25;
        if ((uVar15 & 1) != 0) {
          fVar44 = fVar28;
          fVar28 = fVar25;
        }
        if (uVar14 - 1 < 2) {
          fVar44 = -fVar44;
        }
        fVar52 = fVar78 * fStack_12c - local_118;
        fVar34 = fVar78 * fStack_14c - local_108;
        fVar33 = fVar78 * fStack_11c - (float)local_178;
        fVar25 = fVar78 * fStack_15c - fVar63;
        auVar47._0_8_ = CONCAT44(fStack_15c,fVar25) ^ 0x8000000000000000;
        auVar47._8_4_ = -fStack_15c;
        auVar47._12_4_ = -fStack_15c;
        auVar48._4_12_ = auVar47._4_12_;
        auVar48._0_4_ = fVar25 * fVar25 + fVar33 * fVar33 + fVar52 * fVar52 + fVar34 * fVar34;
        auVar75._0_8_ = CONCAT44(fStack_15c,auVar48._0_4_) ^ 0x8000000000000000;
        auVar75._8_4_ = -fStack_15c;
        auVar75._12_4_ = -fStack_15c;
        auVar22 = rsqrtss(auVar75,auVar48);
        fVar71 = auVar22._0_4_;
        fVar71 = fVar71 * fVar71 * auVar48._0_4_ * -0.5 * fVar71 + fVar71 * 1.5;
        if (uVar14 < 2) {
          fVar28 = -fVar28;
        }
        fVar61 = 1.0 - fVar24;
        fVar53 = fVar61 * fStack_12c + local_118 * fVar24;
        fVar69 = fVar61 * fStack_14c + local_108 * fVar24;
        fVar79 = fVar61 * fStack_11c + (float)local_178 * fVar24;
        fVar60 = fStack_15c * fVar61 + fVar63 * fVar24;
        fVar51 = fVar60 * fVar60 + fVar79 * fVar79 + fVar53 * fVar53 + fVar69 * fVar69;
        auVar81._4_4_ = fStack_15c;
        auVar81._0_4_ = fVar51;
        auVar81._8_4_ = fStack_15c;
        auVar81._12_4_ = fStack_15c;
        auVar22 = rsqrtss(auVar81,auVar81);
        fVar63 = auVar22._0_4_;
        fVar63 = fVar63 * fVar63 * fVar51 * -0.5 * fVar63 + fVar63 * 1.5;
        if (0.9995 < fVar78) {
          fVar53 = fVar53 * fVar63;
          fVar69 = fVar69 * fVar63;
          fVar79 = fVar79 * fVar63;
        }
        else {
          fVar53 = fStack_12c * fVar44 + fVar52 * fVar71 * fVar28;
          fVar69 = fStack_14c * fVar44 + fVar34 * fVar71 * fVar28;
          fVar79 = fStack_11c * fVar44 + fVar33 * fVar71 * fVar28;
        }
        fVar28 = (float)(-(uint)(0.9995 < fVar78) & (uint)(fVar60 * fVar63) |
                        ~-(uint)(0.9995 < fVar78) &
                        (uint)(fVar44 * fStack_15c + fVar25 * fVar71 * fVar28));
        local_48 = in_XMM7._0_4_;
        fStack_44 = in_XMM7._4_4_;
        fStack_40 = in_XMM7._8_4_;
        fVar85 = (float)local_158._0_4_ * fVar61 + local_48 * fVar24;
        local_68 = in_XMM9._0_4_;
        fStack_64 = in_XMM9._4_4_;
        fStack_60 = in_XMM9._8_4_;
        fVar90 = (float)local_128._0_4_ * fVar61 + local_68 * fVar24;
        fVar91 = (float)local_128._4_4_ * fVar61 + fStack_64 * fVar24;
        local_58 = in_XMM8._0_4_;
        fStack_54 = in_XMM8._4_4_;
        fStack_50 = in_XMM8._8_4_;
        fVar71 = (float)local_168._0_4_ * fVar61 + local_58 * fVar24;
        fVar60 = (float)local_168._4_4_ * fVar61 + fStack_54 * fVar24;
        fVar62 = fStack_160 * fVar61 + fStack_50 * fVar24;
        local_78 = in_XMM10._0_4_;
        fStack_74 = in_XMM10._4_4_;
        fStack_70 = in_XMM10._8_4_;
        fVar82 = fVar61 * (float)local_138._0_4_ + fVar24 * local_78;
        fVar83 = fVar61 * (float)local_138._4_4_ + fVar24 * fStack_74;
        fVar84 = fVar61 * fStack_130 + fVar24 * fStack_70;
        fVar78 = fVar53 * fVar53 + fVar69 * fVar69 + -fVar79 * fVar79 + -fVar28 * fVar28;
        fVar67 = fVar69 * fVar79 + fVar53 * fVar28;
        fVar51 = fVar69 * fVar79 - fVar53 * fVar28;
        fVar63 = fVar53 * fVar53 - fVar69 * fVar69;
        fVar68 = fVar79 * fVar79 + fVar63 + -fVar28 * fVar28;
        fVar80 = fVar69 * fVar28 - fVar53 * fVar79;
        fVar25 = fVar53 * fVar79 + fVar69 * fVar28;
        fVar64 = fVar79 * fVar28 + fVar53 * fVar69;
        fVar44 = fVar79 * fVar28 - fVar53 * fVar69;
        fVar67 = fVar67 + fVar67;
        fVar80 = fVar80 + fVar80;
        fVar63 = fVar28 * fVar28 + fVar63 + -fVar79 * fVar79;
        fVar33 = fVar78 * 1.0 + fVar67 * 0.0 + fVar80 * 0.0;
        fVar34 = fVar78 * 0.0 + fVar67 * 1.0 + fVar80 * 0.0;
        fVar52 = fVar78 * 0.0 + fVar67 * 0.0 + fVar80 * 1.0;
        fVar78 = fVar78 * 0.0 + fVar67 * 0.0 + fVar80 * 0.0;
        fVar64 = fVar64 + fVar64;
        fVar51 = fVar51 + fVar51;
        fVar79 = fVar51 * 1.0 + fVar68 * 0.0 + fVar64 * 0.0;
        fVar69 = fVar51 * 0.0 + fVar68 * 1.0 + fVar64 * 0.0;
        fVar53 = fVar51 * 0.0 + fVar68 * 0.0 + fVar64 * 1.0;
        fVar51 = fVar51 * 0.0 + fVar68 * 0.0 + fVar64 * 0.0;
        auVar49._4_4_ = fStack_150 * fVar61 + fStack_40 * fVar24;
        auVar49._0_4_ = (float)local_158._4_4_ * fVar61 + fStack_44 * fVar24;
        auVar49._8_8_ = 0;
        auVar10._4_4_ = fVar91;
        auVar10._0_4_ = fVar90;
        auVar10._8_4_ = fStack_120 * fVar61 + fStack_60 * fVar24;
        auVar10._12_4_ = fStack_11c * fVar61 + fVar50 * fVar24;
        auVar22 = blendps(auVar49,auVar10,4);
        fVar25 = fVar25 + fVar25;
        fVar44 = fVar44 + fVar44;
        fVar24 = fVar25 * 1.0 + fVar44 * 0.0 + fVar63 * 0.0;
        fVar28 = fVar25 * 0.0 + fVar44 * 1.0 + fVar63 * 0.0;
        fVar50 = fVar25 * 0.0 + fVar44 * 0.0 + fVar63 * 1.0;
        fVar44 = fVar25 * 0.0 + fVar44 * 0.0 + fVar63 * 0.0;
        fVar25 = fVar44 * 0.0;
        in_XMM14._0_4_ = fVar85 * fVar33 + fVar79 * 0.0 + fVar24 * 0.0;
        in_XMM14._4_4_ = fVar85 * fVar34 + fVar69 * 0.0 + fVar28 * 0.0;
        in_XMM14._8_4_ = fVar85 * fVar52 + fVar53 * 0.0 + fVar50 * 0.0;
        in_XMM14._12_4_ = fVar85 * fVar78 + fVar51 * 0.0 + fVar25;
        in_XMM1._0_4_ = fVar90 * fVar33 + fVar91 * fVar79 + fVar24 * 0.0;
        in_XMM1._4_4_ = fVar90 * fVar34 + fVar91 * fVar69 + fVar28 * 0.0;
        in_XMM1._8_4_ = fVar90 * fVar52 + fVar91 * fVar53 + fVar50 * 0.0;
        in_XMM1._12_4_ = fVar90 * fVar78 + fVar91 * fVar51 + fVar25;
        in_XMM0._0_4_ = fVar71 * fVar33 + fVar60 * fVar79 + fVar62 * fVar24;
        in_XMM0._4_4_ = fVar71 * fVar34 + fVar60 * fVar69 + fVar62 * fVar28;
        in_XMM0._8_4_ = fVar71 * fVar52 + fVar60 * fVar53 + fVar62 * fVar50;
        in_XMM0._12_4_ = fVar71 * fVar78 + fVar60 * fVar51 + fVar62 * fVar44;
        auVar45._0_4_ = fVar82 * fVar33 + fVar83 * fVar79 + fVar84 * fVar24 + auVar22._0_4_ + 0.0;
        auVar45._4_4_ = fVar82 * fVar34 + fVar83 * fVar69 + fVar84 * fVar28 + auVar22._4_4_ + 0.0;
        auVar45._8_4_ = fVar82 * fVar52 + fVar83 * fVar53 + fVar84 * fVar50 + auVar22._8_4_ + 0.0;
      }
      else {
        if (iVar5 == 0x9134) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x10 + lVar16),0x1c);
          in_XMM14 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x20 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 4 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x14 + lVar16),0x1c);
          auVar22 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x24 + lVar16),0x28);
          auVar88 = insertps(ZEXT416(*(uint *)(lVar13 + 8 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x18 + lVar16),0x1c);
          auVar88 = insertps(auVar88,*(undefined4 *)(lVar13 + 0x28 + lVar16),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 0x1c + lVar16),0x1c);
          auVar38 = insertps(auVar38,*(undefined4 *)(lVar13 + 0x2c + lVar16),0x28);
          auVar29 = auVar38._0_12_;
        }
        else if (iVar5 == 0x9234) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          uVar2 = *(undefined8 *)(lVar13 + 4 + lVar16);
          in_XMM14._4_4_ = (float)(int)uVar2;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar13 + lVar16);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar13 + 0x10 + lVar16);
          auVar22._4_4_ = (int)uVar2;
          auVar22._0_4_ = *(undefined4 *)(lVar13 + 0xc + lVar16);
          auVar22._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar22._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          auVar88._4_4_ = (int)uVar2;
          auVar88._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          auVar88._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar88._12_4_ = 0;
          uVar1 = *(ulong *)(lVar13 + 0x28 + lVar16);
          in_XMM3._8_8_ = 0;
          in_XMM3._0_8_ = uVar1;
          auVar29._4_4_ = (int)uVar1;
          auVar29._0_4_ = (float)*(undefined4 *)(lVar13 + 0x24 + lVar16);
          auVar29._8_4_ = (int)(uVar1 >> 0x20);
        }
        else if (iVar5 == 0xb001) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar16);
          auVar22 = insertps(auVar20,*(undefined4 *)(lVar13 + 8 + lVar16),0x20);
          uVar2 = *(undefined8 *)(lVar13 + 0x34 + lVar16);
          auVar87._4_4_ = (int)uVar2;
          auVar87._0_4_ = *(undefined4 *)(lVar13 + lVar16);
          auVar87._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar87._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          auVar30._4_4_ = (int)uVar2;
          auVar30._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          auVar30._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar30._12_4_ = 0;
          fVar44 = *(float *)(lVar13 + 0x24 + lVar16);
          fVar25 = *(float *)(lVar13 + 0x28 + lVar16);
          fVar28 = *(float *)(lVar13 + 0x2c + lVar16);
          fVar50 = *(float *)(lVar13 + 0x30 + lVar16);
          in_XMM4 = ZEXT416((uint)fVar50);
          fVar78 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar25 * fVar25;
          auVar88 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
          fVar63 = auVar88._0_4_;
          auVar56._4_12_ = auVar88._4_12_;
          fVar63 = fVar63 * fVar63 * fVar78 * -0.5 * fVar63 + fVar63 * 1.5;
          in_XMM6 = ZEXT416((uint)(fVar44 * fVar63));
          auVar88 = insertps(auVar30,in_XMM6,0x30);
          auVar29 = auVar88._0_12_;
          in_XMM14 = insertps(auVar87,ZEXT416((uint)(fVar25 * fVar63)),0x30);
          in_XMM3 = ZEXT416((uint)(fVar28 * fVar63));
          auVar56._0_4_ = fVar63 * fVar50;
          auVar54 = auVar56._0_12_;
          auVar38 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 4 + lVar16),0x10);
          auVar88 = insertps(auVar22,auVar56,0x30);
          auVar22 = insertps(auVar38,*(undefined4 *)(lVar13 + 0x3c + lVar16),0x20);
          auVar22 = insertps(auVar22,in_XMM3,0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar13 = *plVar8;
          lVar16 = plVar8[2] * uVar12;
          in_XMM14 = *(undefined1 (*) [16])(lVar13 + lVar16);
          auVar22 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar16);
          auVar88 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar16);
          auVar29 = SUB1612(*(undefined1 (*) [16])(lVar13 + 0x30 + lVar16),0);
        }
        lVar13 = (ulong)(uVar14 + 1) * 0x38;
        plVar8 = (long *)(lVar9 + lVar13);
        iVar5 = *(int *)(lVar9 + 0x20 + lVar13);
        if (iVar5 == 0x9134) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          auVar38 = insertps(ZEXT416(*(uint *)(lVar9 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x10 + lVar13),0x1c);
          in_XMM4 = insertps(auVar38,*(undefined4 *)(lVar9 + 0x20 + lVar13),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x14 + lVar13),0x1c);
          in_XMM6 = insertps(auVar38,*(undefined4 *)(lVar9 + 0x24 + lVar13),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar13)),
                             *(undefined4 *)(lVar9 + 0x18 + lVar13),0x1c);
          in_XMM3 = insertps(auVar38,*(undefined4 *)(lVar9 + 0x28 + lVar13),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                             *(undefined4 *)(lVar9 + 0x1c + lVar13),0x1c);
          auVar38 = insertps(auVar38,*(undefined4 *)(lVar9 + 0x2c + lVar13),0x28);
          auVar54 = auVar38._0_12_;
        }
        else if (iVar5 == 0x9234) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          uVar2 = *(undefined8 *)(lVar9 + 4 + lVar13);
          in_XMM4._4_4_ = (int)uVar2;
          in_XMM4._0_4_ = *(undefined4 *)(lVar9 + lVar13);
          in_XMM4._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar13);
          in_XMM6._4_4_ = (int)uVar2;
          in_XMM6._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar13);
          in_XMM6._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM6._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
          in_XMM3._4_4_ = (int)uVar2;
          in_XMM3._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
          in_XMM3._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar13);
          auVar54._4_4_ = (int)uVar2;
          auVar54._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar13);
          auVar54._8_4_ = (int)((ulong)uVar2 >> 0x20);
        }
        else if (iVar5 == 0xb001) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar13);
          auVar38 = insertps(auVar35,*(undefined4 *)(lVar9 + 8 + lVar13),0x20);
          uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar13);
          auVar40._4_4_ = (int)uVar2;
          auVar40._0_4_ = *(undefined4 *)(lVar9 + lVar13);
          auVar40._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar40._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar13);
          auVar57._4_4_ = (int)uVar2;
          auVar57._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar13);
          auVar57._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar57._12_4_ = 0;
          fVar44 = *(float *)(lVar9 + 0x24 + lVar13);
          fVar25 = *(float *)(lVar9 + 0x28 + lVar13);
          fVar28 = *(float *)(lVar9 + 0x2c + lVar13);
          fVar50 = *(float *)(lVar9 + 0x30 + lVar13);
          fVar78 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar25 * fVar25;
          auVar76 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
          fVar63 = auVar76._0_4_;
          auVar77._4_12_ = auVar76._4_12_;
          fVar63 = fVar63 * fVar63 * fVar78 * -0.5 * fVar63 + fVar63 * 1.5;
          auVar76 = insertps(auVar57,ZEXT416((uint)(fVar44 * fVar63)),0x30);
          auVar54 = auVar76._0_12_;
          in_XMM4 = insertps(auVar40,ZEXT416((uint)(fVar25 * fVar63)),0x30);
          auVar77._0_4_ = fVar63 * fVar50;
          auVar76 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar13)),
                             *(undefined4 *)(lVar9 + 4 + lVar13),0x10);
          in_XMM3 = insertps(auVar38,auVar77,0x30);
          auVar38 = insertps(auVar76,*(undefined4 *)(lVar9 + 0x3c + lVar13),0x20);
          in_XMM6 = insertps(auVar38,ZEXT416((uint)(fVar28 * fVar63)),0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar9 = *plVar8;
          lVar13 = uVar12 * plVar8[2];
          in_XMM4 = *(undefined1 (*) [16])(lVar9 + lVar13);
          in_XMM6 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar13);
          in_XMM3 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar13);
          auVar54 = SUB1612(*(undefined1 (*) [16])(lVar9 + 0x30 + lVar13),0);
        }
        fVar44 = 1.0 - fVar24;
        fVar25 = in_XMM14._4_4_;
        fVar28 = in_XMM14._8_4_;
        fVar50 = in_XMM14._12_4_;
        in_XMM14._0_4_ = in_XMM14._0_4_ * fVar44 + in_XMM4._0_4_ * fVar24;
        in_XMM14._4_4_ = fVar25 * fVar44 + in_XMM4._4_4_ * fVar24;
        in_XMM14._8_4_ = fVar28 * fVar44 + in_XMM4._8_4_ * fVar24;
        in_XMM14._12_4_ = fVar50 * fVar44 + in_XMM4._12_4_ * fVar24;
        in_XMM1._0_4_ = auVar22._0_4_ * fVar44 + in_XMM6._0_4_ * fVar24;
        in_XMM1._4_4_ = auVar22._4_4_ * fVar44 + in_XMM6._4_4_ * fVar24;
        in_XMM1._8_4_ = auVar22._8_4_ * fVar44 + in_XMM6._8_4_ * fVar24;
        in_XMM1._12_4_ = auVar22._12_4_ * fVar44 + in_XMM6._12_4_ * fVar24;
        in_XMM0._0_4_ = auVar88._0_4_ * fVar44 + in_XMM3._0_4_ * fVar24;
        in_XMM0._4_4_ = auVar88._4_4_ * fVar44 + in_XMM3._4_4_ * fVar24;
        in_XMM0._8_4_ = auVar88._8_4_ * fVar44 + in_XMM3._8_4_ * fVar24;
        in_XMM0._12_4_ = auVar88._12_4_ * fVar44 + in_XMM3._12_4_ * fVar24;
        auVar45._0_4_ = fVar44 * auVar29._0_4_ + fVar24 * auVar54._0_4_;
        auVar45._4_4_ = fVar44 * auVar29._4_4_ + fVar24 * auVar54._4_4_;
        auVar45._8_4_ = fVar44 * auVar29._8_4_ + fVar24 * auVar54._8_4_;
      }
    }
    fVar44 = in_XMM0._0_4_;
    fVar24 = in_XMM0._4_4_;
    fVar25 = in_XMM0._8_4_;
    fVar28 = in_XMM0._12_4_;
    fVar50 = in_XMM1._0_4_;
    fVar63 = in_XMM1._4_4_;
    fVar78 = in_XMM1._8_4_;
    auVar31._0_4_ = fVar50 * fVar24 - fVar44 * fVar63;
    fVar33 = fVar63 * fVar25 - fVar24 * fVar78;
    fVar34 = fVar78 * fVar44 - fVar25 * fVar50;
    auVar36._4_4_ = fVar34;
    auVar36._0_4_ = fVar33;
    auVar36._8_4_ = auVar31._0_4_;
    auVar36._12_4_ = in_XMM1._12_4_ * fVar28 - fVar28 * in_XMM1._12_4_;
    fVar52 = in_XMM14._0_4_;
    fVar71 = in_XMM14._4_4_;
    fVar79 = in_XMM14._8_4_;
    auVar21._0_4_ = fVar44 * fVar71 - fVar24 * fVar52;
    auVar21._4_4_ = fVar24 * fVar79 - fVar25 * fVar71;
    auVar21._8_4_ = fVar25 * fVar52 - fVar44 * fVar79;
    auVar21._12_4_ = fVar28 * in_XMM14._12_4_ - fVar28 * in_XMM14._12_4_;
    auVar88 = dpps(in_XMM14,auVar36,0x7f);
    fVar44 = fVar78 * fVar71 - fVar79 * fVar63;
    auVar27._4_4_ = fVar44;
    auVar27._0_4_ = fVar33;
    auVar22 = insertps(auVar21,auVar21,0x4a);
    auVar31._4_4_ = auVar21._0_4_;
    auVar31._8_4_ = fVar63 * fVar52 - fVar71 * fVar50;
    auVar31._12_4_ = 0;
    auVar27._8_4_ = fVar44;
    auVar27._12_4_ = auVar22._4_4_;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._4_4_ = auVar22._0_4_;
    auVar26._0_4_ = fVar33;
    auVar37._4_4_ = auVar22._8_4_;
    auVar37._0_4_ = fVar34;
    auVar37._8_4_ = fVar50 * fVar79 - fVar52 * fVar78;
    auVar37._12_4_ = auVar22._12_4_;
    auVar89._0_4_ = auVar88._0_4_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar22 = divps(auVar26,auVar89);
    auVar38 = divps(auVar37,auVar89);
    auVar88 = divps(auVar31,auVar89);
    fVar69 = auVar45._0_4_;
    fVar53 = auVar45._4_4_;
    fVar61 = auVar45._8_4_;
    fVar50 = auVar88._0_4_;
    fVar63 = auVar88._4_4_;
    fVar78 = auVar88._8_4_;
    fVar33 = auVar88._12_4_;
    fVar34 = auVar38._0_4_;
    fVar52 = auVar38._4_4_;
    fVar71 = auVar38._8_4_;
    fVar79 = auVar38._12_4_;
    fVar44 = auVar22._0_4_;
    fVar24 = auVar22._4_4_;
    fVar25 = auVar22._8_4_;
    fVar28 = auVar22._12_4_;
    aVar3 = (ray->org).field_0.field_1;
    fVar51 = aVar3.x;
    fVar60 = aVar3.y;
    fVar62 = aVar3.z;
    aVar4 = (ray->dir).field_0.field_1;
    fVar64 = aVar4.x;
    fVar67 = aVar4.y;
    fVar68 = aVar4.z;
    auVar41._0_4_ =
         fVar51 * fVar44 +
         fVar60 * fVar34 + (fVar62 * fVar50 - (fVar69 * fVar44 + fVar53 * fVar34 + fVar61 * fVar50))
    ;
    auVar41._4_4_ =
         fVar51 * fVar24 +
         fVar60 * fVar52 + (fVar62 * fVar63 - (fVar69 * fVar24 + fVar53 * fVar52 + fVar61 * fVar63))
    ;
    auVar41._8_4_ =
         fVar51 * fVar25 +
         fVar60 * fVar71 + (fVar62 * fVar78 - (fVar69 * fVar25 + fVar53 * fVar71 + fVar61 * fVar78))
    ;
    auVar41._12_4_ =
         fVar51 * fVar28 +
         fVar60 * fVar79 + (fVar62 * fVar33 - (fVar69 * fVar28 + fVar53 * fVar79 + fVar61 * fVar33))
    ;
    aVar42.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar41,aVar3,8);
    (ray->org).field_0 = aVar42;
    auVar23._0_4_ = fVar64 * fVar44 + fVar67 * fVar34 + fVar68 * fVar50;
    auVar23._4_4_ = fVar64 * fVar24 + fVar67 * fVar52 + fVar68 * fVar63;
    auVar23._8_4_ = fVar64 * fVar25 + fVar67 * fVar71 + fVar68 * fVar78;
    auVar23._12_4_ = fVar64 * fVar28 + fVar67 * fVar79 + fVar68 * fVar33;
    aVar42.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar23,aVar4,8);
    (ray->dir).field_0 = aVar42;
    (**(code **)(p_Var17 + 0x80))(p_Var17 + 0x58,ray);
    local_188 = aVar3._0_8_;
    uStack_180 = aVar3._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_188;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_180;
    local_178 = aVar4._0_8_;
    uStack_170 = aVar4._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_178;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_170;
    bVar11 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar7->instID[0] = 0xffffffff;
    pRVar7->instPrimID[0] = 0xffffffff;
  }
  return bVar11;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }